

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_loader.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::IrLoader::AddInstruction(IrLoader *this,spv_parsed_instruction_t *inst)

{
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *this_00;
  uint uVar1;
  uint32_t *puVar2;
  IRContext *pIVar3;
  pointer pIVar4;
  char *source;
  Function *pFVar5;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> tVar6;
  pointer puVar7;
  Op OVar8;
  bool bVar9;
  PodType PVar10;
  int32_t iVar11;
  Instruction *i;
  Module *pMVar12;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_01;
  Instruction *pIVar13;
  pointer __p;
  BasicBlock *pBVar14;
  pointer pIVar15;
  ulong uVar16;
  pointer pIVar17;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var18;
  vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
  *this_02;
  long lVar19;
  Instruction *pIVar20;
  MessageConsumer *pMVar21;
  IntrusiveList<spvtools::opt::Instruction> *this_03;
  char *pcVar22;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> *__args;
  Op opcode;
  string message;
  size_type __dnew;
  Op local_9c;
  undefined1 local_98 [24];
  uint *local_80;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_78;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_70;
  spv_position_t local_68;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_48;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_40;
  _Head_base<0UL,_spvtools::opt::Function_*,_false> local_38;
  
  this->inst_index_ = this->inst_index_ + 1;
  bVar9 = IsLineInst(inst);
  if (bVar9) {
    pMVar12 = this->module_;
    pMVar12->contains_debug_info_ = true;
    pIVar20 = (this->last_line_inst_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    (this->last_line_inst_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
    if (pIVar20 != (Instruction *)0x0) {
      (**(code **)((long)(pIVar20->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                         _vptr_IntrusiveNodeBase + 8))();
      pMVar12 = this->module_;
    }
    local_98._0_8_ = pMVar12->context_;
    std::vector<spvtools::opt::Instruction,std::allocator<spvtools::opt::Instruction>>::
    emplace_back<spvtools::opt::IRContext*,spv_parsed_instruction_t_const&,spvtools::opt::DebugScope&>
              ((vector<spvtools::opt::Instruction,std::allocator<spvtools::opt::Instruction>> *)
               &this->dbg_line_info_,(IRContext **)local_98,inst,&this->last_dbg_scope_);
    return true;
  }
  local_9c = (Op)inst->opcode;
  bVar9 = spvIsExtendedInstruction(local_9c);
  if ((bVar9) && (bVar9 = spvExtInstIsDebugInfo(inst->ext_inst_type), bVar9)) {
    puVar2 = inst->words;
    if (puVar2[4] == 0x18) {
      (this->last_dbg_scope_).lexical_scope_ = 0;
      (this->last_dbg_scope_).inlined_at_ = 0;
LAB_00595f86:
      this->module_->contains_debug_info_ = true;
      return true;
    }
    if (puVar2[4] == 0x17) {
      if (inst->num_words < 7) {
        uVar16 = 0;
      }
      else {
        uVar16 = (ulong)puVar2[6] << 0x20;
      }
      this->last_dbg_scope_ = (DebugScope)(puVar2[5] | uVar16);
      goto LAB_00595f86;
    }
  }
  this_01._M_head_impl = (Instruction *)operator_new(0x70);
  Instruction::Instruction(this_01._M_head_impl,this->module_->context_,inst,&this->dbg_line_info_);
  pIVar15 = ((this_01._M_head_impl)->dbg_line_insts_).
            super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (((this_01._M_head_impl)->dbg_line_insts_).
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start == pIVar15) {
    pIVar20 = (this->last_line_inst_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar20 != (Instruction *)0x0) {
      pIVar20->dbg_scope_ = this->last_dbg_scope_;
      pIVar4 = (pIVar20->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pIVar15 = *(pointer *)
                      &(pIVar20->dbg_line_insts_).
                       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                       ._M_impl; pIVar15 != pIVar4; pIVar15 = pIVar15 + 1) {
        pIVar15->dbg_scope_ = this->last_dbg_scope_;
      }
      std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
      push_back(&(this_01._M_head_impl)->dbg_line_insts_,
                (this->last_line_inst_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
      pIVar13 = Instruction::Clone(((this_01._M_head_impl)->dbg_line_insts_).
                                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -1,
                                   this->module_->context_);
      pIVar20 = (this->last_line_inst_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      (this->last_line_inst_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar13;
      if (pIVar20 != (Instruction *)0x0) {
        (**(code **)((long)(pIVar20->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                           _vptr_IntrusiveNodeBase + 8))();
        pIVar13 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      }
      bVar9 = Instruction::IsDebugLineInst(pIVar13);
      if (bVar9) {
        pIVar20 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        pIVar3 = this->module_->context_;
        PVar10.data._M_elems =
             (array<signed_char,_4UL>)
             Module::TakeNextIdBound
                       ((pIVar3->module_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                        .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
        if ((PVar10.data._M_elems == (_Type)0x0) &&
           ((pIVar3->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
          local_68.line._0_4_ = (array<signed_char,_4UL>)0x25;
          local_68.line._4_4_ = (array<signed_char,_4UL>)0x0;
          local_98._0_8_ = (IRContext *)(local_98 + 0x10);
          local_98._0_8_ = std::__cxx11::string::_M_create((ulong *)local_98,(ulong)&local_68);
          local_98._16_8_ = local_68.line;
          ((IRContext *)local_98._0_8_)->syntax_context_ = (spv_context)0x667265766f204449;
          *(undefined8 *)&((IRContext *)local_98._0_8_)->grammar_ = 0x797254202e776f6c;
          (((IRContext *)local_98._0_8_)->grammar_).operandTable_ =
               (spv_operand_table)0x676e696e6e757220;
          (((IRContext *)local_98._0_8_)->grammar_).opcodeTable_ =
               (spv_opcode_table)0x746361706d6f6320;
          *(undefined8 *)((long)&(((IRContext *)local_98._0_8_)->grammar_).opcodeTable_ + 5) =
               0x2e7364692d746361;
          local_98._8_8_ = local_68.line;
          *(char *)((long)&((IRContext *)local_98._0_8_)->syntax_context_ + local_68.line) = '\0';
          local_68.line = 0;
          local_68.column = 0;
          local_68.index = 0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(&pIVar3->consumer_,SPV_MSG_ERROR,"",&local_68,(char *)local_98._0_8_);
          if ((IRContext *)local_98._0_8_ != (IRContext *)(local_98 + 0x10)) goto LAB_0059637f;
          goto LAB_0059638c;
        }
        if (pIVar20->has_result_id_ == false) goto LAB_005963b2;
        if (PVar10.data._M_elems == (_Type)0x0) goto LAB_00596393;
        local_80 = (uint *)(local_98 + 0x10);
        local_98._0_8_ = &PTR__SmallVector_00b02ef8;
        local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_98._16_4_ = PVar10.data._M_elems;
        local_98._8_8_ = 1;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   (*(long *)&(pIVar20->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data +
                    (ulong)((uint)pIVar20->has_type_id_ * 0x30) + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_98);
        local_98._0_8_ = &PTR__SmallVector_00b02ef8;
        if (local_78._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_78,local_78._M_head_impl);
        }
      }
    }
  }
  else {
    if ((this->extra_line_tracking_ == true) &&
       (bVar9 = Instruction::IsNoLine(pIVar15 + -1), !bVar9)) {
      pIVar13 = Instruction::Clone(((this_01._M_head_impl)->dbg_line_insts_).
                                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -1,
                                   this->module_->context_);
      pIVar20 = (this->last_line_inst_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      (this->last_line_inst_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar13;
      if (pIVar20 != (Instruction *)0x0) {
        (**(code **)((long)(pIVar20->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                           _vptr_IntrusiveNodeBase + 8))();
        pIVar13 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      }
      bVar9 = Instruction::IsDebugLineInst(pIVar13);
      if (bVar9) {
        pIVar20 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        pIVar3 = this->module_->context_;
        PVar10.data._M_elems =
             (array<signed_char,_4UL>)
             Module::TakeNextIdBound
                       ((pIVar3->module_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                        .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
        if ((PVar10.data._M_elems == (_Type)0x0) &&
           ((pIVar3->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
          local_98._0_8_ = (IRContext *)(local_98 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"ID overflow. Try running compact-ids.","");
          local_68.line = 0;
          local_68.column = 0;
          local_68.index = 0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(&pIVar3->consumer_,SPV_MSG_ERROR,"",&local_68,(char *)local_98._0_8_);
          if ((IRContext *)local_98._0_8_ != (IRContext *)(local_98 + 0x10)) {
LAB_0059637f:
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
LAB_0059638c:
          if (pIVar20->has_result_id_ != false) {
LAB_00596393:
            __assert_fail("res_id != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
          }
LAB_005963b2:
          __assert_fail("has_result_id_",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
        }
        if (pIVar20->has_result_id_ == false) goto LAB_005963b2;
        if (PVar10.data._M_elems == (_Type)0x0) goto LAB_00596393;
        local_80 = (uint *)(local_98 + 0x10);
        local_98._0_8_ = &PTR__SmallVector_00b02ef8;
        local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_98._16_4_ = PVar10.data._M_elems;
        local_98._8_4_ = (array<signed_char,_4UL>)0x1;
        local_98._12_4_ = (array<signed_char,_4UL>)0x0;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   (*(long *)&(pIVar20->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl + (ulong)((uint)pIVar20->has_type_id_ * 0x30) + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_98);
        local_98._0_8_ = &PTR__SmallVector_00b02ef8;
        if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
            local_78._M_head_impl !=
            (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0)
        {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_78,local_78._M_head_impl);
        }
      }
    }
    pIVar15 = (this->dbg_line_info_).
              super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar4 = (this->dbg_line_info_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pIVar17 = pIVar15;
    if (pIVar4 != pIVar15) {
      do {
        (**(pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase)
                  (pIVar17);
        pIVar17 = pIVar17 + 1;
      } while (pIVar17 != pIVar4);
      (this->dbg_line_info_).
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish = pIVar15;
    }
  }
  source = (this->source_)._M_dataplus._M_p;
  local_98._0_8_ = ZEXT48(this->inst_index_);
  local_98._8_8_ = 0;
  local_98._16_4_ = (array<signed_char,_4UL>)0x0;
  local_98._20_4_ = (array<signed_char,_4UL>)0x0;
  if (local_9c == OpLabel) {
    if ((this->function_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl == (Function *)0x0) {
      pMVar21 = this->consumer_;
      if ((pMVar21->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pcVar22 = "OpLabel outside function";
        goto LAB_00596085;
      }
    }
    else {
      if ((this->block_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl ==
          (BasicBlock *)0x0) {
        pBVar14 = (BasicBlock *)operator_new(0x88);
        pBVar14->function_ = (Function *)0x0;
        (pBVar14->label_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t = (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 )this_01._M_head_impl;
        pIVar20 = &(pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
             (_func_int **)&PTR__Instruction_00b02eb0;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.unique_id_ = 0;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ =
             (IRContext *)0x0;
        *(undefined8 *)
         ((long)&(pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 context_ + 6) = 0;
        *(undefined8 *)
         &(pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl = 0;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(undefined8 *)
         &(pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
          dbg_line_insts_.
          super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
          ._M_impl = 0;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
        lexical_scope_ = 0;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
        inlined_at_ = 0;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar20;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar20;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
        (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
             (_func_int **)&PTR__InstructionList_00b02f48;
        (this->block_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = pBVar14;
        return true;
      }
      pMVar21 = this->consumer_;
      if ((pMVar21->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pcVar22 = "OpLabel inside basic block";
LAB_00596085:
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator()(pMVar21,SPV_MSG_ERROR,source,(spv_position_t *)local_98,pcVar22);
      }
    }
    goto LAB_00596097;
  }
  if (local_9c == OpFunctionEnd) {
    pFVar5 = (this->function_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
    if (pFVar5 == (Function *)0x0) {
      pMVar21 = this->consumer_;
      if ((pMVar21->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pcVar22 = "OpFunctionEnd without corresponding OpFunction";
        goto LAB_00596085;
      }
    }
    else {
      if ((this->block_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl ==
          (BasicBlock *)0x0) {
        tVar6.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               *)&(pFVar5->end_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ;
        (pFVar5->end_inst_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             = (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                )this_01._M_head_impl;
        if (tVar6.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
            (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)0x0) {
          (**(code **)(*(long *)tVar6.
                                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                _M_head_impl + 8))();
        }
        pMVar12 = this->module_;
        local_38._M_head_impl =
             (this->function_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
        (this->function_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl = (Function *)0x0;
        std::
        vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
        ::
        emplace_back<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>
                  ((vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
                    *)&pMVar12->functions_,
                   (unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                    *)&local_38);
        std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
        ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                     *)&local_38);
        std::__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ::reset((__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 *)&this->function_,(pointer)0x0);
        return true;
      }
      pMVar21 = this->consumer_;
      if ((pMVar21->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pcVar22 = "OpFunctionEnd inside basic block";
        goto LAB_00596085;
      }
    }
    goto LAB_00596097;
  }
  if (local_9c == OpFunction) {
    if ((this->function_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl == (Function *)0x0) {
      __p = (pointer)operator_new(0xd0);
      (__p->def_inst_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           this_01._M_head_impl;
      (__p->params_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->params_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->params_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar20 = &(__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
                 sentinel_;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
           (_func_int **)&PTR__Instruction_00b02eb0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      unique_id_ = 0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      context_ = (IRContext *)0x0;
      *(undefined8 *)
       ((long)&(__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
               sentinel_.context_ + 6) = 0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      dbg_line_insts_.
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      dbg_line_insts_.
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      dbg_line_insts_.
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      dbg_scope_.lexical_scope_ = 0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      dbg_scope_.inlined_at_ = 0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar20;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar20;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
      _vptr_IntrusiveList = (_func_int **)&PTR__InstructionList_00b02f48;
      (__p->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p->end_inst_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
      (__p->non_semantic_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->non_semantic_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->non_semantic_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.line = 0;
      std::__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
      reset((__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
             *)&this->function_,__p);
      std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
      ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                   *)&local_68);
      return true;
    }
    pMVar21 = this->consumer_;
    if ((pMVar21->super__Function_base)._M_manager != (_Manager_type)0x0) {
      pcVar22 = "function inside function";
      goto LAB_00596085;
    }
    goto LAB_00596097;
  }
  bVar9 = spvOpcodeIsBlockTerminator(local_9c);
  pFVar5 = (this->function_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
           .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
  if (bVar9) {
    if (pFVar5 == (Function *)0x0) {
      pMVar21 = this->consumer_;
      if ((pMVar21->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pcVar22 = "terminator instruction outside function";
        goto LAB_00596085;
      }
    }
    else {
      _Var18._M_head_impl =
           (this->block_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      if (_Var18._M_head_impl != (BasicBlock *)0x0) {
        this_00 = &this->block_;
        if ((this->last_dbg_scope_).lexical_scope_ != 0) {
          (this_01._M_head_impl)->dbg_scope_ = this->last_dbg_scope_;
          pIVar15 = ((this_01._M_head_impl)->dbg_line_insts_).
                    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pIVar4 = ((this_01._M_head_impl)->dbg_line_insts_).
                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pIVar15 != pIVar4) {
            do {
              pIVar15->dbg_scope_ = this->last_dbg_scope_;
              pIVar15 = pIVar15 + 1;
            } while (pIVar15 != pIVar4);
            _Var18._M_head_impl =
                 (this_00->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          }
        }
        utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                  (&((_Var18._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>,
                   this_01._M_head_impl);
        pFVar5 = (this->function_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                 .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
        local_70._M_head_impl =
             (this->block_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        (this->block_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = (BasicBlock *)0x0;
        opt::Function::AddBasicBlock
                  (pFVar5,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           *)&local_70);
        if (local_70._M_head_impl != (BasicBlock *)0x0) {
          std::default_delete<spvtools::opt::BasicBlock>::operator()
                    ((default_delete<spvtools::opt::BasicBlock> *)&local_70,local_70._M_head_impl);
        }
        local_70._M_head_impl = (BasicBlock *)0x0;
        _Var18._M_head_impl =
             (this_00->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        (this_00->_M_t).
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = (BasicBlock *)0x0;
        if (_Var18._M_head_impl != (BasicBlock *)0x0) {
          std::default_delete<spvtools::opt::BasicBlock>::operator()
                    ((default_delete<spvtools::opt::BasicBlock> *)this_00,_Var18._M_head_impl);
        }
        pIVar20 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        (this->last_line_inst_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             (Instruction *)0x0;
        (this->last_dbg_scope_).lexical_scope_ = 0;
        (this->last_dbg_scope_).inlined_at_ = 0;
        if (pIVar20 != (Instruction *)0x0) {
          (**(code **)((long)(pIVar20->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                             _vptr_IntrusiveNodeBase + 8))();
        }
        pIVar15 = (this->dbg_line_info_).
                  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar4 = (this->dbg_line_info_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pIVar17 = pIVar15;
        if (pIVar4 == pIVar15) {
          return true;
        }
        do {
          (**(pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase)
                    (pIVar17);
          pIVar17 = pIVar17 + 1;
        } while (pIVar17 != pIVar4);
        (this->dbg_line_info_).
        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_finish = pIVar15;
        return true;
      }
      pMVar21 = this->consumer_;
      if ((pMVar21->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pcVar22 = "terminator instruction outside basic block";
        goto LAB_00596085;
      }
    }
    goto LAB_00596097;
  }
  if (pFVar5 != (Function *)0x0) {
    if ((local_9c & ~OpUndef) == OpLoopMerge) {
      (this->last_dbg_scope_).lexical_scope_ = 0;
      (this->last_dbg_scope_).inlined_at_ = 0;
    }
    else if ((this->last_dbg_scope_).lexical_scope_ != 0) {
      (this_01._M_head_impl)->dbg_scope_ = this->last_dbg_scope_;
      pIVar4 = ((this_01._M_head_impl)->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pIVar15 = ((this_01._M_head_impl)->dbg_line_insts_).
                     super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                     ._M_impl.super__Vector_impl_data._M_start; pIVar15 != pIVar4;
          pIVar15 = pIVar15 + 1) {
        pIVar15->dbg_scope_ = this->last_dbg_scope_;
      }
    }
    bVar9 = spvIsExtendedInstruction(local_9c);
    if ((bVar9) && (bVar9 = spvExtInstIsDebugInfo(inst->ext_inst_type), bVar9)) {
      uVar1 = inst->words[4];
      if (inst->ext_inst_type != SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
        if (inst->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
          if ((uVar1 != 0x1d) && (uVar1 != 0x1c)) {
            pMVar21 = this->consumer_;
            pcVar22 = 
            "Debug info extension instruction other than DebugScope, DebugNoScope, DebugFunctionDefinition, DebugDeclare, and DebugValue found inside function"
            ;
            goto LAB_005961f0;
          }
        }
        else if ((uVar1 != 0x1d) && (uVar1 != 0x1c)) goto LAB_005961e6;
        pBVar14 = (this->block_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        if (pBVar14 == (BasicBlock *)0x0) {
          pMVar12 = (Module *)
                    (this->function_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
          goto LAB_005961d9;
        }
LAB_0059606b:
        this_03 = &(pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>;
        goto LAB_00596255;
      }
      if (((uVar1 < 0x1e) && ((0x31800000U >> (uVar1 & 0x1f) & 1) != 0)) || (uVar1 == 0x65)) {
        pBVar14 = (this->block_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        if (pBVar14 == (BasicBlock *)0x0) {
          Logf<spv::Op_const&>
                    (this->consumer_,SPV_MSG_ERROR,source,(spv_position_t *)local_98,
                     "Debug info extension instruction found inside function but outside block",
                     &local_9c);
          bVar9 = true;
          goto LAB_00596099;
        }
        goto LAB_0059606b;
      }
LAB_005961e6:
      pMVar21 = this->consumer_;
      pcVar22 = 
      "Debug info extension instruction other than DebugScope, DebugNoScope, DebugDeclare, and DebugValue found inside function"
      ;
      goto LAB_005961f0;
    }
    pBVar14 = (this->block_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    if (pBVar14 != (BasicBlock *)0x0) goto LAB_0059606b;
    if (local_9c != OpFunctionParameter) {
      pMVar21 = this->consumer_;
      pcVar22 = "Non-OpFunctionParameter (opcode: %d) found inside function but outside basic block"
      ;
      goto LAB_005961f0;
    }
    __args = &local_48;
    this_02 = (vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
               *)&((this->function_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                   .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl)->params_;
    local_48._M_head_impl = this_01._M_head_impl;
    goto LAB_005960ca;
  }
  if ((this->block_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl != (BasicBlock *)0x0)
  {
    local_68.line = 0xb7;
    local_68.column = 0;
    local_68.index = 0;
    Log(this->consumer_,SPV_MSG_INTERNAL_ERROR,
        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_loader.cpp"
        ,&local_68,"assertion failed: block_ == nullptr");
    exit(1);
  }
  switch(local_9c) {
  case OpSourceContinued:
  case OpSource:
  case OpSourceExtension:
  case OpString:
    lVar19 = 0x288;
    break;
  case OpName:
  case OpMemberName:
  case OpLine:
  case OpLine|OpUndef:
  case OpExtInst:
  case OpExtInst|OpUndef:
    goto switchD_00595fd9_caseD_5;
  case OpExtension:
    lVar19 = 0x98;
    break;
  case OpExtInstImport:
    lVar19 = 0x110;
    break;
  case OpMemoryModel:
    pIVar20 = (this->module_->memory_model_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    (this->module_->memory_model_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = this_01._M_head_impl;
    goto LAB_005961c1;
  case OpEntryPoint:
    lVar19 = 0x198;
    break;
  case OpExecutionMode:
switchD_00595fd9_caseD_10:
    lVar19 = 0x210;
    break;
  case OpCapability:
    pMVar12 = this->module_;
LAB_005961d9:
    this_03 = &(pMVar12->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>;
    goto LAB_00596255;
  default:
    if (local_9c == OpExecutionModeId) goto switchD_00595fd9_caseD_10;
    if (local_9c == OpSamplerImageAddressingModeNV) {
      pIVar20 = (this->module_->sampled_image_address_mode_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      (this->module_->sampled_image_address_mode_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           this_01._M_head_impl;
      goto LAB_005961c1;
    }
switchD_00595fd9_caseD_5:
    if (local_9c - OpName < 2) {
      lVar19 = 0x300;
    }
    else if (local_9c == OpModuleProcessed) {
      lVar19 = 0x378;
    }
    else {
      bVar9 = IsAnnotationInst(local_9c);
      OVar8 = local_9c;
      if (bVar9) {
        lVar19 = 0x468;
      }
      else {
        iVar11 = spvOpcodeGeneratesType(local_9c);
        if (((OVar8 == OpTypeForwardPointer) || (iVar11 != 0)) ||
           ((iVar11 = spvOpcodeIsConstant(local_9c), iVar11 != 0 ||
            ((local_9c == OpVariable || (local_9c == OpUndef)))))) {
          lVar19 = 0x4e0;
        }
        else {
          bVar9 = spvIsExtendedInstruction(local_9c);
          if ((!bVar9) || (bVar9 = spvExtInstIsDebugInfo(inst->ext_inst_type), !bVar9)) {
            bVar9 = spvIsExtendedInstruction(local_9c);
            if ((!bVar9) || (bVar9 = spvExtInstIsNonSemantic(inst->ext_inst_type), !bVar9)) {
              pMVar21 = this->consumer_;
              pcVar22 = "Unhandled inst type (opcode: %d) found outside function definition.";
LAB_005961f0:
              Logf<spv::Op_const&>
                        (pMVar21,SPV_MSG_ERROR,source,(spv_position_t *)local_98,pcVar22,&local_9c);
LAB_00596097:
              bVar9 = false;
LAB_00596099:
              (**(code **)((long)((this_01._M_head_impl)->
                                 super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                 _vptr_IntrusiveNodeBase + 8))(this_01._M_head_impl);
              return bVar9;
            }
            pMVar12 = this->module_;
            puVar7 = (pMVar12->functions_).
                     super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((pMVar12->functions_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != puVar7) {
              this_02 = (vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                         *)&(puVar7[-1]._M_t.
                             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl)
                            ->non_semantic_;
              __args = &local_40;
              local_40._M_head_impl = this_01._M_head_impl;
LAB_005960ca:
              std::
              vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
              ::
              emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                        (this_02,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                  *)__args);
              pIVar20 = __args->_M_head_impl;
LAB_005961c1:
              if (pIVar20 == (Instruction *)0x0) {
                return true;
              }
              (*(pIVar20->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                _vptr_IntrusiveNodeBase[1])();
              return true;
            }
            this_03 = &(pMVar12->types_values_).super_IntrusiveList<spvtools::opt::Instruction>;
            goto LAB_00596255;
          }
          lVar19 = 0x3f0;
        }
      }
    }
  }
  this_03 = (IntrusiveList<spvtools::opt::Instruction> *)
            ((long)&(this->module_->header_).magic_number + lVar19);
LAB_00596255:
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back(this_03,this_01._M_head_impl);
  return true;
}

Assistant:

bool IrLoader::AddInstruction(const spv_parsed_instruction_t* inst) {
  ++inst_index_;
  if (IsLineInst(inst)) {
    module()->SetContainsDebugInfo();
    last_line_inst_.reset();
    dbg_line_info_.emplace_back(module()->context(), *inst, last_dbg_scope_);
    return true;
  }

  // If it is a DebugScope or DebugNoScope of debug extension, we do not
  // create a new instruction, but simply keep the information in
  // struct DebugScope.
  const auto opcode = static_cast<spv::Op>(inst->opcode);
  if (spvIsExtendedInstruction(opcode) &&
      spvExtInstIsDebugInfo(inst->ext_inst_type)) {
    const uint32_t ext_inst_index = inst->words[kExtInstSetIndex];
    if (inst->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100 ||
        inst->ext_inst_type ==
            SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
      const CommonDebugInfoInstructions ext_inst_key =
          CommonDebugInfoInstructions(ext_inst_index);
      if (ext_inst_key == CommonDebugInfoDebugScope) {
        uint32_t inlined_at = 0;
        if (inst->num_words > kInlinedAtIndex)
          inlined_at = inst->words[kInlinedAtIndex];
        last_dbg_scope_ =
            DebugScope(inst->words[kLexicalScopeIndex], inlined_at);
        module()->SetContainsDebugInfo();
        return true;
      }
      if (ext_inst_key == CommonDebugInfoDebugNoScope) {
        last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
        module()->SetContainsDebugInfo();
        return true;
      }
    } else {
      const DebugInfoInstructions ext_inst_key =
          DebugInfoInstructions(ext_inst_index);
      if (ext_inst_key == DebugInfoDebugScope) {
        uint32_t inlined_at = 0;
        if (inst->num_words > kInlinedAtIndex)
          inlined_at = inst->words[kInlinedAtIndex];
        last_dbg_scope_ =
            DebugScope(inst->words[kLexicalScopeIndex], inlined_at);
        module()->SetContainsDebugInfo();
        return true;
      }
      if (ext_inst_key == DebugInfoDebugNoScope) {
        last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
        module()->SetContainsDebugInfo();
        return true;
      }
    }
  }

  std::unique_ptr<Instruction> spv_inst(
      new Instruction(module()->context(), *inst, std::move(dbg_line_info_)));
  if (!spv_inst->dbg_line_insts().empty()) {
    if (extra_line_tracking_ &&
        (!spv_inst->dbg_line_insts().back().IsNoLine())) {
      last_line_inst_ = std::unique_ptr<Instruction>(
          spv_inst->dbg_line_insts().back().Clone(module()->context()));
      if (last_line_inst_->IsDebugLineInst())
        last_line_inst_->SetResultId(module()->context()->TakeNextId());
    }
    dbg_line_info_.clear();
  } else if (last_line_inst_ != nullptr) {
    last_line_inst_->SetDebugScope(last_dbg_scope_);
    spv_inst->dbg_line_insts().push_back(*last_line_inst_);
    last_line_inst_ = std::unique_ptr<Instruction>(
        spv_inst->dbg_line_insts().back().Clone(module()->context()));
    if (last_line_inst_->IsDebugLineInst())
      last_line_inst_->SetResultId(module()->context()->TakeNextId());
  }

  const char* src = source_.c_str();
  spv_position_t loc = {inst_index_, 0, 0};

  // Handle function and basic block boundaries first, then normal
  // instructions.
  if (opcode == spv::Op::OpFunction) {
    if (function_ != nullptr) {
      Error(consumer_, src, loc, "function inside function");
      return false;
    }
    function_ = MakeUnique<Function>(std::move(spv_inst));
  } else if (opcode == spv::Op::OpFunctionEnd) {
    if (function_ == nullptr) {
      Error(consumer_, src, loc,
            "OpFunctionEnd without corresponding OpFunction");
      return false;
    }
    if (block_ != nullptr) {
      Error(consumer_, src, loc, "OpFunctionEnd inside basic block");
      return false;
    }
    function_->SetFunctionEnd(std::move(spv_inst));
    module_->AddFunction(std::move(function_));
    function_ = nullptr;
  } else if (opcode == spv::Op::OpLabel) {
    if (function_ == nullptr) {
      Error(consumer_, src, loc, "OpLabel outside function");
      return false;
    }
    if (block_ != nullptr) {
      Error(consumer_, src, loc, "OpLabel inside basic block");
      return false;
    }
    block_ = MakeUnique<BasicBlock>(std::move(spv_inst));
  } else if (spvOpcodeIsBlockTerminator(opcode)) {
    if (function_ == nullptr) {
      Error(consumer_, src, loc, "terminator instruction outside function");
      return false;
    }
    if (block_ == nullptr) {
      Error(consumer_, src, loc, "terminator instruction outside basic block");
      return false;
    }
    if (last_dbg_scope_.GetLexicalScope() != kNoDebugScope)
      spv_inst->SetDebugScope(last_dbg_scope_);
    block_->AddInstruction(std::move(spv_inst));
    function_->AddBasicBlock(std::move(block_));
    block_ = nullptr;
    last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
    last_line_inst_.reset();
    dbg_line_info_.clear();
  } else {
    if (function_ == nullptr) {  // Outside function definition
      SPIRV_ASSERT(consumer_, block_ == nullptr);
      if (opcode == spv::Op::OpCapability) {
        module_->AddCapability(std::move(spv_inst));
      } else if (opcode == spv::Op::OpExtension) {
        module_->AddExtension(std::move(spv_inst));
      } else if (opcode == spv::Op::OpExtInstImport) {
        module_->AddExtInstImport(std::move(spv_inst));
      } else if (opcode == spv::Op::OpMemoryModel) {
        module_->SetMemoryModel(std::move(spv_inst));
      } else if (opcode == spv::Op::OpSamplerImageAddressingModeNV) {
        module_->SetSampledImageAddressMode(std::move(spv_inst));
      } else if (opcode == spv::Op::OpEntryPoint) {
        module_->AddEntryPoint(std::move(spv_inst));
      } else if (opcode == spv::Op::OpExecutionMode ||
                 opcode == spv::Op::OpExecutionModeId) {
        module_->AddExecutionMode(std::move(spv_inst));
      } else if (IsDebug1Inst(opcode)) {
        module_->AddDebug1Inst(std::move(spv_inst));
      } else if (IsDebug2Inst(opcode)) {
        module_->AddDebug2Inst(std::move(spv_inst));
      } else if (IsDebug3Inst(opcode)) {
        module_->AddDebug3Inst(std::move(spv_inst));
      } else if (IsAnnotationInst(opcode)) {
        module_->AddAnnotationInst(std::move(spv_inst));
      } else if (IsTypeInst(opcode)) {
        module_->AddType(std::move(spv_inst));
      } else if (IsConstantInst(opcode) || opcode == spv::Op::OpVariable ||
                 opcode == spv::Op::OpUndef) {
        module_->AddGlobalValue(std::move(spv_inst));
      } else if (spvIsExtendedInstruction(opcode) &&
                 spvExtInstIsDebugInfo(inst->ext_inst_type)) {
        module_->AddExtInstDebugInfo(std::move(spv_inst));
      } else if (spvIsExtendedInstruction(opcode) &&
                 spvExtInstIsNonSemantic(inst->ext_inst_type)) {
        // If there are no functions, add the non-semantic instructions to the
        // global values. Otherwise append it to the list of the last function.
        auto func_begin = module_->begin();
        auto func_end = module_->end();
        if (func_begin == func_end) {
          module_->AddGlobalValue(std::move(spv_inst));
        } else {
          (--func_end)->AddNonSemanticInstruction(std::move(spv_inst));
        }
      } else {
        Errorf(consumer_, src, loc,
               "Unhandled inst type (opcode: %d) found outside function "
               "definition.",
               opcode);
        return false;
      }
    } else {
      if (opcode == spv::Op::OpLoopMerge || opcode == spv::Op::OpSelectionMerge)
        last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
      if (last_dbg_scope_.GetLexicalScope() != kNoDebugScope)
        spv_inst->SetDebugScope(last_dbg_scope_);
      if (spvIsExtendedInstruction(opcode) &&
          spvExtInstIsDebugInfo(inst->ext_inst_type)) {
        const uint32_t ext_inst_index = inst->words[kExtInstSetIndex];
        if (inst->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
          const OpenCLDebugInfo100Instructions ext_inst_key =
              OpenCLDebugInfo100Instructions(ext_inst_index);
          switch (ext_inst_key) {
            case OpenCLDebugInfo100DebugDeclare: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            case OpenCLDebugInfo100DebugValue: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            default: {
              Errorf(consumer_, src, loc,
                     "Debug info extension instruction other than DebugScope, "
                     "DebugNoScope, DebugFunctionDefinition, DebugDeclare, and "
                     "DebugValue found inside function",
                     opcode);
              return false;
            }
          }
        } else if (inst->ext_inst_type ==
                   SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
          const NonSemanticShaderDebugInfo100Instructions ext_inst_key =
              NonSemanticShaderDebugInfo100Instructions(ext_inst_index);
          switch (ext_inst_key) {
            case NonSemanticShaderDebugInfo100DebugDeclare:
            case NonSemanticShaderDebugInfo100DebugValue:
            case NonSemanticShaderDebugInfo100DebugScope:
            case NonSemanticShaderDebugInfo100DebugNoScope:
            case NonSemanticShaderDebugInfo100DebugFunctionDefinition: {
              if (block_ == nullptr) {  // Inside function but outside blocks
                Errorf(consumer_, src, loc,
                       "Debug info extension instruction found inside function "
                       "but outside block",
                       opcode);
              } else {
                block_->AddInstruction(std::move(spv_inst));
              }
              break;
            }
            default: {
              Errorf(consumer_, src, loc,
                     "Debug info extension instruction other than DebugScope, "
                     "DebugNoScope, DebugDeclare, and DebugValue found inside "
                     "function",
                     opcode);
              return false;
            }
          }
        } else {
          const DebugInfoInstructions ext_inst_key =
              DebugInfoInstructions(ext_inst_index);
          switch (ext_inst_key) {
            case DebugInfoDebugDeclare: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            case DebugInfoDebugValue: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            default: {
              Errorf(consumer_, src, loc,
                     "Debug info extension instruction other than DebugScope, "
                     "DebugNoScope, DebugDeclare, and DebugValue found inside "
                     "function",
                     opcode);
              return false;
            }
          }
        }
      } else {
        if (block_ == nullptr) {  // Inside function but outside blocks
          if (opcode != spv::Op::OpFunctionParameter) {
            Errorf(consumer_, src, loc,
                   "Non-OpFunctionParameter (opcode: %d) found inside "
                   "function but outside basic block",
                   opcode);
            return false;
          }
          function_->AddParameter(std::move(spv_inst));
        } else {
          block_->AddInstruction(std::move(spv_inst));
        }
      }
    }
  }
  return true;
}